

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::internal::SwapFieldHelper::SwapNonInlinedStrings<false>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  ArenaStringPtr *lhs_00;
  ArenaStringPtr *rhs_00;
  Arena *lhs_arena;
  Arena *rhs_arena;
  ArenaStringPtr *rhs_string;
  ArenaStringPtr *lhs_string;
  FieldDescriptor *field_local;
  Message *rhs_local;
  Message *lhs_local;
  Reflection *r_local;
  
  lhs_00 = Reflection::MutableRaw<google::protobuf::internal::ArenaStringPtr>(r,lhs,field);
  rhs_00 = Reflection::MutableRaw<google::protobuf::internal::ArenaStringPtr>(r,rhs,field);
  lhs_arena = MessageLite::GetArena(&lhs->super_MessageLite);
  rhs_arena = MessageLite::GetArena(&rhs->super_MessageLite);
  SwapArenaStringPtr(lhs_00,lhs_arena,rhs_00,rhs_arena);
  return;
}

Assistant:

void SwapFieldHelper::SwapNonInlinedStrings(const Reflection* r, Message* lhs,
                                            Message* rhs,
                                            const FieldDescriptor* field) {
  ArenaStringPtr* lhs_string = r->MutableRaw<ArenaStringPtr>(lhs, field);
  ArenaStringPtr* rhs_string = r->MutableRaw<ArenaStringPtr>(rhs, field);
  if (unsafe_shallow_swap) {
    ArenaStringPtr::UnsafeShallowSwap(lhs_string, rhs_string);
  } else {
    SwapFieldHelper::SwapArenaStringPtr(lhs_string, lhs->GetArena(),  //
                                        rhs_string, rhs->GetArena());
  }
}